

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O1

time_point __thiscall jaegertracing::Span::startTimeSteady(Span *this)

{
  duration dVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x148));
  if (iVar2 == 0) {
    dVar1.__r = *(rep *)(this + 0xf0);
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
    return (time_point)(duration)dVar1.__r;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

SteadyClock::time_point startTimeSteady() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _startTimeSteady;
    }